

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void real_suite::fail_as_string(void)

{
  char input [4];
  decoder_type decoder;
  value_type local_1a4 [4];
  double local_1a0 [4];
  undefined8 local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_decoder<char> local_158;
  
  local_158.input.tail = local_1a4 + 3;
  builtin_memcpy(local_1a4,"1.0",4);
  local_158.input.head = local_1a4;
  memset(&local_158.current,0,0x120);
  local_158.current.code = uninitialized;
  local_158.current.view.head = (const_pointer)0x0;
  local_158.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
  local_1a0[0] = (double)CONCAT44(local_1a0[0]._4_4_,local_158.current.code);
  local_180 = CONCAT44(local_180._4_4_,9);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x5bd,"void real_suite::fail_as_string()",local_1a0,&local_180);
  local_1a0[0] = trial::protocol::json::detail::basic_decoder<char>::real_value<double>(&local_158);
  local_180 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("decoder.real_value<double>()","1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x5be,"void real_suite::fail_as_string()",local_1a0,&local_180);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_178,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  boost::detail::throw_failed_impl
            ("decoder.string_value<std::string>()","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x5c0,"void real_suite::fail_as_string()");
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}